

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O1

bool __thiscall Js::DynamicType::LockType(DynamicType *this)

{
  DynamicTypeHandler *pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  bool bVar6;
  
  if ((this->isLocked == true) && (pDVar1 = (this->typeHandler).ptr, (pDVar1->flags & 4) != 0)) {
    iVar4 = (*pDVar1->_vptr_DynamicTypeHandler[4])();
    bVar6 = true;
    if (iVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x67,"(this->GetTypeHandler()->IsLockable())",
                                  "this->GetTypeHandler()->IsLockable()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else {
    iVar4 = (*((this->typeHandler).ptr)->_vptr_DynamicTypeHandler[4])();
    if (iVar4 == 0) {
      bVar6 = false;
    }
    else {
      DynamicTypeHandler::LockTypeHandler((this->typeHandler).ptr);
      this->isLocked = true;
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool DynamicType::LockType()
    {
        if (GetIsLocked() && this->GetTypeHandler()->GetIsLocked())
        {
            Assert(this->GetTypeHandler()->IsLockable());
            return true;
        }
        if (this->GetTypeHandler()->IsLockable())
        {
            this->GetTypeHandler()->LockTypeHandler();
            this->isLocked = true;
            return true;
        }
        return false;
    }